

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O3

void __thiscall mocker::LoopInvariantCodeMotion::insertPreHeaders(LoopInvariantCodeMotion *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *labelID;
  FunctionModule *this_00;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *ppVar2;
  __node_base _Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  BBLIter BVar6;
  BasicBlock *pBVar7;
  _Hash_node_base *p_Var8;
  _func_int **pp_Var9;
  __hash_code __code;
  ulong uVar10;
  _Hash_node_base *p_Var11;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _List_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar15;
  shared_ptr<mocker::ir::Reg> preHeaderPhiDest;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionMoved;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  optionLeft;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  outerPreds;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  Preds;
  undefined1 local_1a9;
  shared_ptr<mocker::ir::Label> local_1a8;
  Phi local_198;
  BasicBlock *local_150;
  LoopInvariantCodeMotion *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  shared_ptr<mocker::ir::IRInst> local_138;
  shared_ptr<mocker::ir::IRInst> local_128;
  undefined1 local_118 [32];
  pointer local_f8;
  pointer pbStack_f0;
  pointer local_e8;
  _List_node_base *local_d8;
  _Hash_node_base *local_d0;
  _List_node_base *local_c8;
  FunctionModule *local_c0;
  undefined8 local_b8;
  __buckets_ptr pp_Stack_b0;
  size_type local_a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&local_68,(this->super_FuncPass).func);
  p_Var14 = (this->loopTree).loops._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    local_d8 = (_List_node_base *)&this->preHeaders;
    local_148 = this;
    do {
      if (p_Var14[5]._M_nxt != (_Hash_node_base *)0x1) {
        labelID = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_nxt;
        uVar10 = (ulong)labelID % local_68._M_bucket_count;
        if (((_Hash_node_base *)(local_68._M_buckets + uVar10))->_M_nxt == (__node_base_ptr)0x0) {
LAB_001110b8:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var8 = ((_Hash_node_base *)(local_68._M_buckets + uVar10))->_M_nxt->_M_nxt;
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_nxt;
        p_Var11 = p_Var8;
        if (labelID == p_Var12) {
          p_Var11 = p_Var8[2]._M_nxt;
        }
        else {
          do {
            p_Var11 = p_Var11->_M_nxt;
            if ((p_Var11 == (_Hash_node_base *)0x0) ||
               ((ulong)p_Var11[1]._M_nxt % local_68._M_bucket_count != uVar10)) goto LAB_001110b8;
          } while (labelID != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_nxt);
          p_Var11 = p_Var11[2]._M_nxt;
          while (labelID != p_Var12) {
            p_Var8 = p_Var8->_M_nxt;
            if ((p_Var8 == (_Hash_node_base *)0x0) ||
               (p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8[1]._M_nxt,
               (ulong)p_Var12 % local_68._M_bucket_count != uVar10)) goto LAB_001110b8;
          }
        }
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _Hashtable<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_a0,p_Var11,p_Var8[3]._M_nxt,0,&local_1a8,
                   &local_198.super_Definition.dest.
                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                    *)&local_b8);
        subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
                  ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&local_a0,
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)(p_Var14 + 2));
        this_00 = (this->super_FuncPass).func;
        if ((_List_node_base *)p_Var14[1]._M_nxt !=
            (this_00->bbs).
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
            _M_impl._M_node.super__List_node_base._M_next[1]._M_next) {
          if (local_a0._M_element_count == 0) {
            __assert_fail("!outerPreds.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                          ,0x3c,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
          }
          local_150 = ir::FunctionModule::getMutableBasicBlock(this_00,(size_t)labelID);
          BVar6 = ir::FunctionModule::pushBackBB((this->super_FuncPass).func);
          local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BVar6._M_node[1]._M_next;
          local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)labelID;
          local_140 = local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          pVar15 = std::
                   _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<std::pair<unsigned_long,unsigned_long>>
                             ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)local_d8,&local_1a8);
          local_198.super_Definition._vptr_Definition = (_func_int **)BVar6;
          _Var3._M_nxt = local_a0._M_before_begin._M_nxt;
          if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __assert_fail("tmp",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/loopinv.cpp"
                          ,0x43,"void mocker::LoopInvariantCodeMotion::insertPreHeaders()");
          }
          for (; _Var3._M_nxt != (_Hash_node_base *)0x0; _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
            pBVar7 = ir::FunctionModule::getMutableBasicBlock
                               ((this->super_FuncPass).func,(size_t)_Var3._M_nxt[1]._M_nxt);
            p_Var13 = (pBVar7->insts).
                      super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev;
            replaceTerminatorLabel
                      ((mocker *)&local_1a8,(shared_ptr<mocker::ir::IRInst> *)(p_Var13 + 1),
                       (size_t)labelID,(size_t)local_140);
            _Var5._M_pi = local_1a8.
                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar4 = local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var13[1]._M_prev;
            p_Var13[1]._M_next = (_List_node_base *)peVar4;
            p_Var13[1]._M_prev = (_List_node_base *)_Var5._M_pi;
            if ((p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12),
               local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
          }
          local_198.super_Definition._vptr_Definition =
               (_func_int **)((long)local_198.super_Definition._vptr_Definition + 0x10);
          local_c8 = (_List_node_base *)&local_150->insts;
          p_Var13 = (local_150->insts).
                    super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          local_d0 = p_Var14;
          if (p_Var13 != local_c8) {
            do {
              p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var13[1]._M_next;
              if (p_Var12->_M_use_count != 0xf) break;
              local_198.super_Definition.dest.
              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)p_Var13[1]._M_prev;
              if (local_198.super_Definition.dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&((local_198.super_Definition.dest.
                             super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->identifier)._M_dataplus._M_p =
                       *(int *)&((local_198.super_Definition.dest.
                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->identifier)._M_dataplus._M_p + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&((local_198.super_Definition.dest.
                             super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                           ->identifier)._M_dataplus._M_p =
                       *(int *)&((local_198.super_Definition.dest.
                                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->identifier)._M_dataplus._M_p + 1;
                }
              }
              local_c0 = (this->super_FuncPass).func;
              local_a8 = 0;
              local_b8._0_1_ = false;
              local_b8._1_7_ = 0;
              pp_Stack_b0 = (__buckets_ptr)0x0;
              local_e8 = (pointer)0x0;
              local_f8 = (pointer)0x0;
              pbStack_f0 = (pointer)0x0;
              __args = *(pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                         **)&p_Var12[2]._M_use_count;
              ppVar2 = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                        *)p_Var12[3]._vptr__Sp_counted_base;
              if (__args == ppVar2) {
LAB_00110e7c:
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)local_198.super_Definition.dest.
                              super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                ;
                if (local_198.super_Definition.dest.
                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&((local_198.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->identifier)._M_dataplus._M_p =
                         *(int *)&((local_198.super_Definition.dest.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier)._M_dataplus._M_p + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&((local_198.super_Definition.dest.
                               super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->identifier)._M_dataplus._M_p =
                         *(int *)&((local_198.super_Definition.dest.
                                    super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->identifier)._M_dataplus._M_p + 1;
                  }
                }
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pBVar7 = (BasicBlock *)local_198.super_Definition._vptr_Definition;
                this = local_148;
                local_198.super_Definition.dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     p_Var12;
              }
              else {
                do {
                  p_Var14 = (_Hash_node_base *)
                            ((__args->second).
                             super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id;
                  p_Var8 = (_Hash_node_base *)0x0;
                  if ((((_Hash_node_base *)
                       (local_a0._M_buckets + (ulong)p_Var14 % local_a0._M_bucket_count))->_M_nxt !=
                       (__node_base_ptr)0x0) &&
                     (p_Var11 = ((_Hash_node_base *)
                                (local_a0._M_buckets + (ulong)p_Var14 % local_a0._M_bucket_count))->
                                _M_nxt->_M_nxt, p_Var8 = p_Var11, p_Var14 != p_Var11[1]._M_nxt)) {
                    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (_Hash_node_base *)0x0) {
                      p_Var8 = (_Hash_node_base *)0x0;
                      if (((ulong)p_Var11[1]._M_nxt % local_a0._M_bucket_count !=
                           (ulong)p_Var14 % local_a0._M_bucket_count) ||
                         (p_Var8 = p_Var11, p_Var14 == p_Var11[1]._M_nxt)) goto LAB_00110cff;
                    }
                    p_Var8 = (_Hash_node_base *)0x0;
                  }
LAB_00110cff:
                  this_01 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                             *)&local_f8;
                  if (p_Var8 == (_Hash_node_base *)0x0) {
                    this_01 = (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                               *)&local_b8;
                  }
                  std::
                  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                  ::
                  emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>const&>
                            (this_01,__args);
                  __args = __args + 1;
                } while (__args != ppVar2);
                if (local_f8 == pbStack_f0) goto LAB_00110e7c;
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_198.super_IRInst._vptr_IRInst._0_1_ = 0;
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_198;
                ir::FunctionModule::makeTempLocalReg
                          ((FunctionModule *)local_118,&local_c0->identifier);
                if ((Phi *)local_1a8.
                           super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != &local_198) {
                  operator_delete(local_1a8.
                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,CONCAT71(local_198.super_IRInst._vptr_IRInst._1_7_,
                                                  local_198.super_IRInst._vptr_IRInst._0_1_) + 1);
                }
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
                (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count = 1;
                (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = 1;
                (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 1);
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._M_use_count = local_140;
                std::
                vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                ::emplace_back<std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Label>>
                          ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                            *)&local_b8,(shared_ptr<mocker::ir::Reg> *)local_118,&local_1a8);
                if (local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1a8.
                             super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                          (&local_1a8.
                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(Phi **)&local_1a8,
                           (allocator<mocker::ir::Phi> *)(local_118 + 0x10),
                           (shared_ptr<mocker::ir::Reg> *)&p_Var12[1]._M_use_count,
                           (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                            *)&local_b8);
                local_118._16_8_ = (pointer)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 0x18),
                           (Phi **)(local_118 + 0x10),(allocator<mocker::ir::Phi> *)&local_1a9,
                           (shared_ptr<mocker::ir::Reg> *)local_118,
                           (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                            *)&local_f8);
                this = local_148;
                pBVar7 = (BasicBlock *)local_198.super_Definition._vptr_Definition;
                local_198.super_Definition.dest.
                super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_1a8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)local_1a8.
                              super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._16_8_;
                local_198.options.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118._24_8_;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
                }
              }
              std::
              vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                         *)&local_f8);
              std::
              vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
              ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                         *)&local_b8);
              if (local_198.options.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       local_198.options.
                       super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_198.options.
                     super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (local_198.options.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var1 = &((local_198.options.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var1 = &((local_198.options.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount;
                    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                  }
                }
                ir::BasicBlock::appendInst(pBVar7,&local_128);
                if ((pointer)local_128.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_128.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                p_Var13[1]._M_next =
                     (_List_node_base *)
                     local_198.super_Definition.dest.
                     super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var13[1]._M_prev,
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198.options);
              }
              if (local_198.options.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_198.options.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              if ((element_type *)
                  local_198.options.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_198.options.
                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_198.super_Definition.dest.
                  super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_198.super_Definition.dest.
                           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              }
              p_Var13 = p_Var13->_M_next;
            } while (p_Var13 != local_c8);
          }
          pp_Var9 = (_func_int **)operator_new(0x20);
          pp_Var9[1] = (_func_int *)0x100000001;
          *pp_Var9 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001e8af0;
          pp_Var9[2] = (_func_int *)&PTR__Addr_001e8b68;
          pp_Var9[3] = (_func_int *)labelID;
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count = 1;
          (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_weak_count = 1;
          (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8cb8;
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 1);
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._M_use_count = 0xc;
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d08;
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d28;
          *(_func_int ***)
           &local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi[2]._M_use_count = pp_Var9 + 2;
          local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[3]._vptr__Sp_counted_base = pp_Var9;
          ir::BasicBlock::appendInst
                    ((BasicBlock *)local_198.super_Definition._vptr_Definition,&local_138);
          p_Var14 = local_d0;
          if (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_138.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          simplifyPhiFunctions(local_150);
          simplifyPhiFunctions((BasicBlock *)local_198.super_Definition._vptr_Definition);
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_a0);
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  removeDeletedInsts((this->super_FuncPass).func);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void LoopInvariantCodeMotion::insertPreHeaders() {
  const auto Preds = buildBlockPredecessors(func);

  for (auto &kv : loopTree.getLoops()) {
    auto header = kv.first;
    auto &loopNodes = kv.second;
    if (loopNodes.size() == 1) // is not a loop header
      continue;
    std::unordered_set<std::size_t> outerPreds(Preds.at(header).begin(),
                                               Preds.at(header).end());
    subSet(outerPreds, loopNodes);

    if (kv.first == func.getFirstBBLabel())
      continue;

    assert(!outerPreds.empty());

    // Insert a pre-header. Be careful with the phi-functions
    auto &headBB = func.getMutableBasicBlock(header);
    auto &preHeaderBB = *func.pushBackBB();
    auto preHeader = preHeaderBB.getLabelID();
    auto tmp = preHeaders.emplace(std::make_pair(header, preHeader)).second;
    assert(tmp);

    // adjust the terminators of the outer predecessors
    for (auto &pred : outerPreds) {
      auto &bb = func.getMutableBasicBlock(pred);
      auto &terminator = bb.getMutableInsts().back();
      terminator = replaceTerminatorLabel(terminator, header, preHeader);
    }

    // adjust the phi-functions
    for (auto &inst : headBB.getMutableInsts()) {
      const auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;
      auto newPhis = splitPhi(func, phi, outerPreds, preHeader);
      if (newPhis.second) {
        preHeaderBB.appendInst(newPhis.second);
        inst = newPhis.first;
      }
    }
    preHeaderBB.appendInst(
        std::make_shared<ir::Jump>(std::make_shared<ir::Label>(header)));
    simplifyPhiFunctions(headBB);
    simplifyPhiFunctions(preHeaderBB);
  }
  removeDeletedInsts(func);
}